

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O2

interval_t __thiscall duckdb::MakeIntervalNice(duckdb *this,interval_t interval)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  interval_t iVar6;
  
  lVar5 = interval._0_8_;
  if ((int)this < 6) {
    uVar2 = (ulong)this >> 0x20;
    iVar1 = (int)((ulong)this >> 0x20);
    if (iVar1 < 5 && (int)this < 1) {
      if (lVar5 < 21600000000 && iVar1 < 1) {
        if (lVar5 < 3600000000) {
          if (lVar5 < 600000000) {
            if (lVar5 < 60000000) {
              if (lVar5 < 10000000) goto LAB_01dfdcca;
              pcVar4 = (char *)(lVar5 + 500000);
              uVar3 = 1000000;
            }
            else {
              pcVar4 = "_ZNSt12_Vector_baseIN6duckdb13AllocatedDataESaIS1_EE11_M_allocateEm" +
                       lVar5 + 0x34;
              uVar3 = 15000000;
            }
          }
          else {
            pcVar4 = (char *)(lVar5 + 30000000);
            uVar3 = 60000000;
          }
          uVar3 = ((ulong)pcVar4 & 0xffffffff) % uVar3;
        }
        else {
          pcVar4 = (char *)(lVar5 + 450000000);
          uVar3 = (ulong)pcVar4 % 900000000;
        }
      }
      else {
        pcVar4 = (char *)(lVar5 + 1800000000);
        uVar3 = (long)pcVar4 % 3600000000;
      }
      lVar5 = (long)pcVar4 - uVar3;
      goto LAB_01dfdcca;
    }
  }
  else {
    uVar2 = 0;
  }
  lVar5 = 0;
LAB_01dfdcca:
  iVar6._0_8_ = (ulong)this & 0xffffffff | uVar2 << 0x20;
  iVar6.micros = lVar5;
  return iVar6;
}

Assistant:

interval_t MakeIntervalNice(interval_t interval) {
	if (interval.months >= 6) {
		// if we have more than 6 months, we don't care about days
		interval.days = 0;
		interval.micros = 0;
	} else if (interval.months > 0 || interval.days >= 5) {
		// if we have any months or more than 5 days, we don't care about micros
		interval.micros = 0;
	} else if (interval.days > 0 || interval.micros >= 6 * Interval::MICROS_PER_HOUR) {
		// if we any days or more than 6 hours, we want micros to be roundable by hours at least
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_HOUR);
	} else if (interval.micros >= Interval::MICROS_PER_HOUR) {
		// if we have more than an hour, we want micros to be divisible by quarter hours
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_MINUTE * 15);
	} else if (interval.micros >= Interval::MICROS_PER_MINUTE * 10) {
		// if we have more than 10 minutes, we want micros to be divisible by minutes
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_MINUTE);
	} else if (interval.micros >= Interval::MICROS_PER_MINUTE) {
		// if we have more than a minute, we want micros to be divisible by quarter minutes
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_SEC * 15);
	} else if (interval.micros >= Interval::MICROS_PER_SEC * 10) {
		// if we have more than 10 seconds, we want micros to be divisible by seconds
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_SEC);
	}
	return interval;
}